

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_gnu_longname(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed
                           )

{
  wchar_t wVar1;
  undefined1 local_50 [8];
  archive_string longname;
  wchar_t err;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_50 = (undefined1  [8])0x0;
  longname.s = (char *)0x0;
  longname.length = 0;
  longname.buffer_length._4_4_ = read_body_to_string(a,tar,(archive_string *)local_50,h,unconsumed);
  if ((longname.buffer_length._4_4_ == L'\0') &&
     (wVar1 = _archive_entry_copy_pathname_l(entry,(char *)local_50,(size_t)longname.s,tar->sconv),
     wVar1 != L'\0')) {
    longname.buffer_length._4_4_ = set_conversion_failed_error(a,tar->sconv,"Pathname");
  }
  archive_string_free((archive_string *)local_50);
  return longname.buffer_length._4_4_;
}

Assistant:

static int
header_gnu_longname(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err;
	struct archive_string longname;

	archive_string_init(&longname);
	err = read_body_to_string(a, tar, &longname, h, unconsumed);
	if (err == ARCHIVE_OK) {
		if (archive_entry_copy_pathname_l(entry, longname.s,
		    archive_strlen(&longname), tar->sconv) != 0)
			err = set_conversion_failed_error(a, tar->sconv, "Pathname");
	}
	archive_string_free(&longname);
	return (err);
}